

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O3

void __thiscall
aeron::ExclusivePublication::ExclusivePublication
          (ExclusivePublication *this,ClientConductor *conductor,string *channel,
          int64_t registrationId,int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> *logBuffers)

{
  uint uVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  void *pvVar6;
  ulong uVar7;
  int32_t iVar8;
  long *plVar9;
  length_t lVar10;
  int iVar11;
  long lVar13;
  long lVar14;
  uint uVar12;
  
  this->_vptr_ExclusivePublication = (_func_int **)&PTR__ExclusivePublication_00163c98;
  this->m_conductor = conductor;
  this->m_logMetaDataBuffer =
       ((logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_buffers + 3;
  (this->m_channel)._M_dataplus._M_p = (pointer)&(this->m_channel).field_2;
  pcVar2 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_channel,pcVar2,pcVar2 + channel->_M_string_length);
  this->m_registrationId = registrationId;
  this->m_originalRegistrationId = originalRegistrationId;
  uVar1 = ((logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_buffers[0].m_length;
  this->m_maxPossiblePosition = (long)(int)uVar1 << 0x1f;
  this->m_streamId = streamId;
  this->m_sessionId = sessionId;
  puVar3 = this->m_logMetaDataBuffer->m_buffer;
  this->m_initialTermId = *(int32_t *)(puVar3 + 0x108);
  uVar12 = uVar1 + 7;
  if (-1 < (long)(int)uVar1) {
    uVar12 = uVar1;
  }
  iVar11 = (int)uVar12 >> 3;
  if (0xffffff < iVar11) {
    iVar11 = 0x1000000;
  }
  this->m_maxPayloadLength = *(int *)(puVar3 + 0x110) + -0x20;
  this->m_maxMessageLength = iVar11;
  iVar11 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar11;
  this->m_activePartitionIndex = *(int *)(puVar3 + 0x18) % 3;
  (this->m_publicationLimit).m_impl.m_buffer._vptr_AtomicBuffer =
       (_func_int **)&PTR__AtomicBuffer_00162a10;
  (this->m_publicationLimit).m_impl.m_buffer.m_buffer = (uint8_t *)0x0;
  (this->m_publicationLimit).m_impl.m_buffer.m_length = 0;
  (this->m_publicationLimit).m_impl.m_buffer.m_buffer = (publicationLimit->m_buffer).m_buffer;
  (this->m_publicationLimit).m_impl.m_buffer.m_length = (publicationLimit->m_buffer).m_length;
  iVar8 = publicationLimit->m_offset;
  (this->m_publicationLimit).m_impl.m_id = publicationLimit->m_id;
  (this->m_publicationLimit).m_impl.m_offset = iVar8;
  this->m_channelStatusId = channelStatusId;
  (this->m_isClosed)._M_base._M_i = false;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  this->m_appenders[0]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  this->m_appenders[1]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  this->m_appenders[2]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  puVar3 = this->m_logMetaDataBuffer->m_buffer;
  (this->m_headerWriter).m_sessionId = *(int32_t *)(puVar3 + 0x14c);
  (this->m_headerWriter).m_streamId = *(int32_t *)(puVar3 + 0x150);
  lVar14 = 0x18;
  lVar13 = 0;
  do {
    plVar9 = (long *)operator_new(0x10);
    peVar5 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *plVar9 = (long)&((element_type *)(peVar5->m_buffers + -1))->_vptr_LogBuffers + lVar14;
    plVar9[1] = (long)(peVar5->m_buffers[3].m_buffer + lVar13);
    pvVar6 = *(void **)((long)&this->m_appenders[0]._M_t.
                               super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                               .
                               super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                               ._M_head_impl + lVar13);
    *(long **)((long)&this->m_appenders[0]._M_t.
                      super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                      .
                      super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                      ._M_head_impl + lVar13) = plVar9;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar13 = lVar13 + 8;
    lVar14 = lVar14 + 0x18;
  } while (lVar13 != 0x18);
  uVar7 = **(ulong **)
            ((long)this->m_appenders[this->m_activePartitionIndex]._M_t.
                   super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   .
                   super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
            + 8);
  this->m_termId = (int32_t)(uVar7 >> 0x20);
  lVar10 = ((logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
           ->m_buffers[0].m_length;
  if ((long)(uVar7 & 0xffffffff) < (long)(int)lVar10) {
    lVar10 = (length_t)uVar7;
  }
  this->m_termOffset = lVar10;
  this->m_termBeginPosition =
       ((long)uVar7 >> 0x20) - (long)this->m_initialTermId <<
       ((byte)this->m_positionBitsToShift & 0x3f);
  return;
}

Assistant:

ExclusivePublication::ExclusivePublication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_activePartitionIndex(LogBufferDescriptor::indexByTermCount(LogBufferDescriptor::activeTermCount(m_logMetaDataBuffer))),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<ExclusiveTermAppender>(new ExclusiveTermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }

    const std::int64_t rawTail = m_appenders[m_activePartitionIndex]->rawTail();
    m_termId = LogBufferDescriptor::termId(rawTail);
    m_termOffset = LogBufferDescriptor::termOffset(rawTail, logBuffers->atomicBuffer(0).capacity());
    m_termBeginPosition = LogBufferDescriptor::computeTermBeginPosition(m_termId, m_positionBitsToShift, m_initialTermId);
}